

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool google::protobuf::anon_unknown_19::CheckParseInputSize
               (StringPiece input,ErrorCollector *error_collector)

{
  char *pcVar1;
  char *pcVar2;
  char *i;
  _Alloc_hider in_stack_fffffffffffffe90;
  undefined1 local_160 [16];
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  char *local_60;
  undefined8 local_58;
  
  i = input.ptr_;
  if (0x7fffffff < (long)i) {
    local_60 = "Input size too large: ";
    local_58 = 0x16;
    pcVar1 = local_120.digits;
    local_120.piece_data_ = pcVar1;
    pcVar2 = FastInt64ToBufferLeft((int64)i,pcVar1);
    local_120.piece_size_ = (long)pcVar2 - (long)pcVar1;
    local_90.piece_data_ = " bytes";
    local_90.piece_size_ = 6;
    local_c0.piece_data_ = " > ";
    local_c0.piece_size_ = 3;
    pcVar1 = local_150.digits;
    local_150.piece_data_ = pcVar1;
    pcVar2 = FastInt32ToBufferLeft(0x7fffffff,pcVar1);
    local_150.piece_size_ = (long)pcVar2 - (long)pcVar1;
    local_f0.piece_data_ = " bytes.";
    local_f0.piece_size_ = 7;
    StrCat_abi_cxx11_((string *)&stack0xfffffffffffffe90,(protobuf *)&local_60,&local_120,&local_90,
                      &local_c0,&local_150,&local_f0,(AlphaNum *)in_stack_fffffffffffffe90._M_p);
    (**(code **)(*(long *)input.length_ + 0x10))
              ((long *)input.length_,0xffffffff,0,(string *)&stack0xfffffffffffffe90);
    if ((AlphaNum *)in_stack_fffffffffffffe90._M_p != (AlphaNum *)local_160) {
      operator_delete(in_stack_fffffffffffffe90._M_p);
    }
  }
  return (long)i < 0x80000000;
}

Assistant:

bool CheckParseInputSize(StringPiece input,
                         io::ErrorCollector* error_collector) {
  if (input.size() > INT_MAX) {
    error_collector->AddError(
        -1, 0,
        StrCat("Input size too large: ", static_cast<int64>(input.size()),
                     " bytes", " > ", INT_MAX, " bytes."));
    return false;
  }
  return true;
}